

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O0

stbrp__findresult stbrp__skyline_pack_rectangle(stbrp_context *context,int width,int height)

{
  stbrp_node *psVar1;
  stbrp_node *psVar2;
  bool bVar3;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  stbrp_context *unaff_retaddr;
  stbrp_node *next_1;
  stbrp_node *next;
  stbrp_node *cur;
  stbrp_node *node;
  stbrp__findresult res;
  stbrp_node *local_30;
  undefined8 local_10;
  
  _local_10 = stbrp__skyline_find_best_pos(unaff_retaddr,local_10._12_4_,local_10._8_4_);
  if (((stack0xfffffffffffffff8 == (stbrp_node **)0x0) ||
      (*(int *)(in_RDI + 4) < local_10._4_4_ + in_EDX)) || (*(long *)(in_RDI + 0x20) == 0)) {
    stack0xfffffffffffffff8 = (stbrp_node **)0x0;
  }
  else {
    psVar1 = *(stbrp_node **)(in_RDI + 0x20);
    psVar1->x = (stbrp_coord)local_10;
    psVar1->y = local_10._4_2_ + (short)in_EDX;
    *(stbrp_node **)(in_RDI + 0x20) = psVar1->next;
    local_30 = *stack0xfffffffffffffff8;
    if ((int)(uint)local_30->x < (int)local_10) {
      psVar2 = local_30->next;
      local_30->next = psVar1;
      local_30 = psVar2;
    }
    else {
      *stack0xfffffffffffffff8 = psVar1;
    }
    while( true ) {
      bVar3 = false;
      if (local_30->next != (stbrp_node *)0x0) {
        bVar3 = (int)(uint)local_30->next->x <= (int)local_10 + in_ESI;
      }
      if (!bVar3) break;
      psVar2 = local_30->next;
      local_30->next = *(stbrp_node **)(in_RDI + 0x20);
      *(stbrp_node **)(in_RDI + 0x20) = local_30;
      local_30 = psVar2;
    }
    psVar1->next = local_30;
    if ((int)(uint)local_30->x < (int)local_10 + in_ESI) {
      local_30->x = (stbrp_coord)local_10 + (short)in_ESI;
    }
  }
  return _local_10;
}

Assistant:

static stbrp__findresult stbrp__skyline_pack_rectangle(stbrp_context *context, int width, int height)
{
   // find best position according to heuristic
   stbrp__findresult res = stbrp__skyline_find_best_pos(context, width, height);
   stbrp_node *node, *cur;

   // bail if:
   //    1. it failed
   //    2. the best node doesn't fit (we don't always check this)
   //    3. we're out of memory
   if (res.prev_link == NULL || res.y + height > context->height || context->free_head == NULL) {
      res.prev_link = NULL;
      return res;
   }

   // on success, create new node
   node = context->free_head;
   node->x = (stbrp_coord) res.x;
   node->y = (stbrp_coord) (res.y + height);

   context->free_head = node->next;

   // insert the new node into the right starting point, and
   // let 'cur' point to the remaining nodes needing to be
   // stiched back in

   cur = *res.prev_link;
   if (cur->x < res.x) {
      // preserve the existing one, so start testing with the next one
      stbrp_node *next = cur->next;
      cur->next = node;
      cur = next;
   } else {
      *res.prev_link = node;
   }

   // from here, traverse cur and free the nodes, until we get to one
   // that shouldn't be freed
   while (cur->next && cur->next->x <= res.x + width) {
      stbrp_node *next = cur->next;
      // move the current node to the free list
      cur->next = context->free_head;
      context->free_head = cur;
      cur = next;
   }

   // stitch the list back in
   node->next = cur;

   if (cur->x < res.x + width)
      cur->x = (stbrp_coord) (res.x + width);

#ifdef _DEBUG
   cur = context->active_head;
   while (cur->x < context->width) {
      STBRP_ASSERT(cur->x < cur->next->x);
      cur = cur->next;
   }
   STBRP_ASSERT(cur->next == NULL);

   {
      int count=0;
      cur = context->active_head;
      while (cur) {
         cur = cur->next;
         ++count;
      }
      cur = context->free_head;
      while (cur) {
         cur = cur->next;
         ++count;
      }
      STBRP_ASSERT(count == context->num_nodes+2);
   }
#endif

   return res;
}